

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

bool __thiscall cmsys::RegularExpression::compile(RegularExpression *this,char *exp)

{
  ulong in_RAX;
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uStack_38;
  int flags;
  
  if (exp == (char *)0x0) {
    pcVar1 = "RegularExpression::compile(): No expression supplied.";
  }
  else {
    regsize = 0;
    regnpar = 1;
    regcode = &regdummy;
    regparse = exp;
    uStack_38 = in_RAX;
    regc(-100);
    pcVar1 = reg(0,&flags);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = "RegularExpression::compile(): Error in compile.";
    }
    else {
      this->searchstring = (char *)0x0;
      this->endp[0] = (char *)0x0;
      this->startp[0] = (char *)0x0;
      if ((long)regsize < 0x7fff) {
        if (this->program != (char *)0x0) {
          operator_delete__(this->program);
        }
        uVar4 = regsize;
        regcode = (char *)operator_new__(regsize);
        this->program = regcode;
        this->progsize = (int)uVar4;
        regnpar = 1;
        regparse = exp;
        regc(-100);
        reg(0,&flags);
        this->regstart = '\0';
        this->reganch = '\0';
        this->regmust = (char *)0x0;
        this->regmlen = 0;
        pcVar1 = this->program;
        pcVar2 = regnext(pcVar1 + 1);
        if (*pcVar2 != '\0') {
          return true;
        }
        if (pcVar1[4] == '\x01') {
          this->reganch = '\x01';
        }
        else if (pcVar1[4] == '\b') {
          this->regstart = pcVar1[7];
        }
        if ((uStack_38 & 0x400000000) == 0) {
          return true;
        }
        pcVar2 = (char *)0x0;
        uVar4 = 0;
        for (pcVar1 = pcVar1 + 4; pcVar1 != (char *)0x0; pcVar1 = regnext(pcVar1)) {
          if (*pcVar1 == '\b') {
            sVar3 = strlen(pcVar1 + 3);
            if (uVar4 <= sVar3) {
              pcVar2 = pcVar1 + 3;
            }
            if (uVar4 < sVar3) {
              uVar4 = sVar3;
            }
          }
        }
        this->regmust = pcVar2;
        this->regmlen = uVar4;
        return true;
      }
      pcVar1 = "RegularExpression::compile(): Expression too big.";
    }
  }
  puts(pcVar1);
  return false;
}

Assistant:

bool RegularExpression::compile (const char* exp) {
    const char* scan;
    const char* longest;
    size_t      len;
    int         flags;

    if (exp == 0) {
      //RAISE Error, SYM(RegularExpression), SYM(No_Expr),
      printf ("RegularExpression::compile(): No expression supplied.\n");
      return false;
    }

    // First pass: determine size, legality.
    regparse = exp;
    regnpar = 1;
    regsize = 0L;
    regcode = &regdummy;
    regc(static_cast<char>(MAGIC));
    if(!reg(0, &flags))
      {
        printf ("RegularExpression::compile(): Error in compile.\n");
        return false;
      }
    this->startp[0] = this->endp[0] = this->searchstring = 0;

    // Small enough for pointer-storage convention?
    if (regsize >= 32767L) {    // Probably could be 65535L.
      //RAISE Error, SYM(RegularExpression), SYM(Expr_Too_Big),
      printf ("RegularExpression::compile(): Expression too big.\n");
      return false;
    }

    // Allocate space.
//#ifndef WIN32
    if (this->program != 0) delete [] this->program;
//#endif
    this->program = new char[regsize];
    this->progsize = static_cast<int>(regsize);

    if (this->program == 0) {
      //RAISE Error, SYM(RegularExpression), SYM(Out_Of_Memory),
      printf ("RegularExpression::compile(): Out of memory.\n");
      return false;
    }

    // Second pass: emit code.
    regparse = exp;
    regnpar = 1;
    regcode = this->program;
    regc(static_cast<char>(MAGIC));
    reg(0, &flags);

    // Dig out information for optimizations.
    this->regstart = '\0';              // Worst-case defaults.
    this->reganch = 0;
    this->regmust = 0;
    this->regmlen = 0;
    scan = this->program + 1;   // First BRANCH.
    if (OP(regnext(scan)) == END) {     // Only one top-level choice.
        scan = OPERAND(scan);

        // Starting-point info.
        if (OP(scan) == EXACTLY)
            this->regstart = *OPERAND(scan);
        else if (OP(scan) == BOL)
            this->reganch++;

         //
         // If there's something expensive in the r.e., find the longest
         // literal string that must appear and make it the regmust.  Resolve
         // ties in favor of later strings, since the regstart check works
         // with the beginning of the r.e. and avoiding duplication
         // strengthens checking.  Not a strong reason, but sufficient in the
         // absence of others.
         //
        if (flags & SPSTART) {
            longest = 0;
            len = 0;
            for (; scan != 0; scan = regnext(scan))
                if (OP(scan) == EXACTLY && strlen(OPERAND(scan)) >= len) {
                    longest = OPERAND(scan);
                    len = strlen(OPERAND(scan));
                }
            this->regmust = longest;
            this->regmlen = len;
        }
    }
    return true;
}